

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

void __thiscall Assimp::AMFImporter::ParseNode_Metadata(AMFImporter *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  CAMFImporter_NodeElement_Metadata *this_00;
  allocator<char> local_91;
  undefined1 local_90 [8];
  string an;
  uint local_5c;
  int idx_end;
  int idx;
  CAMFImporter_NodeElement *ne;
  string value;
  string type;
  AMFImporter *this_local;
  
  std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&ne);
  _idx_end = (CAMFImporter_NodeElement_Metadata *)0x0;
  local_5c = 0;
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[4])();
  for (; (int)local_5c < iVar2; local_5c = local_5c + 1) {
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[5])(this->mReader,(ulong)local_5c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_90,(char *)CONCAT44(extraout_var,iVar3),&local_91);
    std::allocator<char>::~allocator(&local_91);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_90,"type");
    if (bVar1) {
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)local_5c);
      std::__cxx11::string::operator=
                ((string *)(value.field_2._M_local_buf + 8),(char *)CONCAT44(extraout_var_00,iVar3))
      ;
    }
    else {
      Throw_IncorrectAttr(this,(string *)local_90);
    }
    std::__cxx11::string::~string((string *)local_90);
  }
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xe])();
  std::__cxx11::string::operator=((string *)&ne,(char *)CONCAT44(extraout_var_01,iVar2));
  this_00 = (CAMFImporter_NodeElement_Metadata *)operator_new(0x90);
  CAMFImporter_NodeElement_Metadata::CAMFImporter_NodeElement_Metadata
            (this_00,this->mNodeElement_Cur);
  _idx_end = this_00;
  std::__cxx11::string::operator=
            ((string *)&this_00->Type,(string *)(value.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=((string *)&_idx_end->Value,(string *)&ne);
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_Cur->Child,(value_type *)&idx_end);
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_List,(value_type *)&idx_end);
  std::__cxx11::string::~string((string *)&ne);
  std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  return;
}

Assistant:

void AMFImporter::ParseNode_Metadata()
{
    std::string type, value;
    CAMFImporter_NodeElement* ne( nullptr );

	// read attribute
	MACRO_ATTRREAD_LOOPBEG;
		MACRO_ATTRREAD_CHECK_RET("type", type, mReader->getAttributeValue);
	MACRO_ATTRREAD_LOOPEND;
	// and value of node.
	value = mReader->getNodeData();
	// Create node element and assign read data.
	ne = new CAMFImporter_NodeElement_Metadata(mNodeElement_Cur);
	((CAMFImporter_NodeElement_Metadata*)ne)->Type = type;
	((CAMFImporter_NodeElement_Metadata*)ne)->Value = value;
	mNodeElement_Cur->Child.push_back(ne);// Add element to child list of current element
	mNodeElement_List.push_back(ne);// and to node element list because its a new object in graph.
}